

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
fixedPreciseMeasurement_doubleOps_Test::~fixedPreciseMeasurement_doubleOps_Test
          (fixedPreciseMeasurement_doubleOps_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, doubleOps)
{
    fixed_precise_measurement freq(9.0, precise::Hz);
    EXPECT_EQ(freq.units(), precise::one / precise::s);
    auto freq2 = 2.0 * freq;
    EXPECT_DOUBLE_EQ(freq2.value(), 18.0);
    bool res = std::is_same<decltype(freq), decltype(freq2)>::value;
    EXPECT_TRUE(res);

    auto f4 = freq * 3;
    EXPECT_DOUBLE_EQ(f4.value(), 27.0);

    auto f3 = freq / 3;
    EXPECT_DOUBLE_EQ(static_cast<float>(f3.value()), 3.0);

    auto f1 = 9.0 / freq;
    EXPECT_TRUE(f1 == (1.0 * precise::s));
    EXPECT_TRUE((1.0 * precise::s) == f1);

    auto fp1 = freq + 3.0;
    EXPECT_DOUBLE_EQ(fp1.value(), 12.0);

    auto fp2 = 3.0 + freq;
    EXPECT_DOUBLE_EQ(fp2.value(), 12.0);

    auto fp3 = freq - 3.0;
    EXPECT_DOUBLE_EQ(fp3.value(), 6.0);

    auto fp4 = 12.0 - freq;
    EXPECT_DOUBLE_EQ(fp4.value(), 3.0);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
}